

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

float __thiscall lda::digamma(lda *this,float x)

{
  lda_math_mode lVar1;
  ostream *poVar2;
  float fVar3;
  type tVar4;
  float x_00;
  uint in_XMM0_Db;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined8 uStack_8;
  undefined1 auVar7 [16];
  
  lVar1 = this->mmode;
  uStack_8 = (ulong)lVar1;
  if (lVar1 == USE_SIMD) {
    x_00 = x + 2.0;
    fVar3 = ldamath::fastlog(x_00);
    fVar5 = x + x + 1.0;
    auVar7._8_4_ = in_XMM0_Db ^ 0x80000000;
    auVar7._0_8_ = CONCAT44(in_XMM0_Db,fVar5) ^ 0x8000000000000000;
    auVar7._12_4_ = in_XMM0_Db;
    auVar6._8_8_ = auVar7._8_8_;
    auVar6._0_8_ = CONCAT44(x * 6.0 + 13.0,fVar5) ^ 0x80000000;
    auVar8._4_4_ = x_00 * 12.0 * x_00;
    auVar8._0_4_ = x * (x + 1.0);
    auVar8._8_4_ = x * (x + 0.0);
    auVar8._12_4_ = x_00 * (x + 0.0);
    auVar8 = divps(auVar6,auVar8);
    return fVar3 + (auVar8._0_4_ - auVar8._4_4_);
  }
  if (lVar1 != USE_PRECISE) {
    if (lVar1 == USE_FAST_APPROX) {
      fVar3 = ldamath::fastdigamma(x);
      return fVar3;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "lda::digamma: Trampled or invalid math mode, aborting");
    std::endl<char,std::char_traits<char>>(poVar2);
    abort();
  }
  tVar4 = boost::math::
          digamma<float,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    (x,(policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                        *)((long)&uStack_8 + 7));
  return tVar4;
}

Assistant:

float lda::digamma(float x)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      // std::cerr << "lda::digamma FAST_APPROX ";
      return ldamath::digamma<float, USE_FAST_APPROX>(x);
    case USE_PRECISE:
      // std::cerr << "lda::digamma PRECISE ";
      return ldamath::digamma<float, USE_PRECISE>(x);
    case USE_SIMD:
      // std::cerr << "lda::digamma SIMD ";
      return ldamath::digamma<float, USE_SIMD>(x);
    default:
      // Should not happen.
      std::cerr << "lda::digamma: Trampled or invalid math mode, aborting" << std::endl;
      abort();
      return 0.0f;
  }
}